

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O3

ZCC_OpProto * __thiscall
ZCC_OpInfoType::FindBestProto(ZCC_OpInfoType *this,PType *optype,Conversion **route,int *numslots)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ZCC_OpProto *pZVar4;
  ZCC_OpProto *pZVar5;
  uint uVar6;
  Conversion *routes [2] [8];
  Conversion **local_d0;
  Conversion *apCStack_b8 [17];
  
  if (optype != (PType *)0x0) {
    pZVar5 = this->Protos;
    uVar3 = 0;
    if (pZVar5 == (ZCC_OpProto *)0x0) {
      pZVar4 = (ZCC_OpProto *)0x0;
    }
    else {
      uVar6 = 0x7fffffff;
      local_d0 = (Conversion **)0x0;
      pZVar4 = (ZCC_OpProto *)0x0;
      do {
        if (pZVar5->Type2 == (PType *)0x0) {
          lVar1 = uVar3 * 8;
          uVar2 = PType::FindConversion(optype,pZVar5->Type1,apCStack_b8 + lVar1,8);
          if ((int)uVar2 < (int)uVar6 && -1 < (int)uVar2) {
            uVar3 = (ulong)((uint)uVar3 ^ 1);
            pZVar4 = pZVar5;
            uVar6 = uVar2;
            local_d0 = apCStack_b8 + lVar1;
          }
        }
      } while ((uVar6 != 0) && (pZVar5 = pZVar5->Next, pZVar5 != (ZCC_OpProto *)0x0));
      if ((route != (Conversion **)0x0) && (local_d0 != (Conversion **)0x0)) {
        uVar2 = *numslots;
        if (0 < (int)uVar2) {
          if ((int)uVar6 <= (int)uVar2) {
            uVar2 = uVar6;
          }
          *numslots = uVar2;
          if (0 < (int)uVar6) {
            memcpy(route,local_d0,(ulong)uVar2 << 3);
          }
        }
      }
    }
    return pZVar4;
  }
  __assert_fail("optype != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/zscript/zcc_expr.cpp"
                ,0x79,
                "ZCC_OpProto *ZCC_OpInfoType::FindBestProto(PType *, const PType::Conversion **, int &)"
               );
}

Assistant:

ZCC_OpProto *ZCC_OpInfoType::FindBestProto(PType *optype, const PType::Conversion **route, int &numslots)
{
	assert(optype != NULL);

	const PType::Conversion *routes[2][CONVERSION_ROUTE_SIZE];
	const PType::Conversion **best_route = NULL;
	int cur_route = 0;
	ZCC_OpProto *best_proto = NULL;
	int best_dist = INT_MAX;

	// Find the best prototype.
	for (ZCC_OpProto *proto = Protos; best_dist != 0 && proto != NULL; proto = proto->Next)
	{
		if (proto->Type2 != NULL)
		{ // Not a unary prototype.
			continue;
		}
		int dist = optype->FindConversion(proto->Type1, routes[cur_route], CONVERSION_ROUTE_SIZE);
		if (dist >= 0 && dist < best_dist)
		{
			best_dist = dist;
			best_proto = proto;
			best_route = routes[cur_route];
			cur_route ^= 1;
		}
	}
	// Copy best conversion route to the caller's array.
	if (best_route != NULL && route != NULL && numslots > 0)
	{
		numslots = MIN(numslots, best_dist);
		if (numslots > 0)
		{
			memcpy(route, best_route, sizeof(*route) * numslots);
		}
	}
	return best_proto;
}